

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

MixMaterial *
pbrt::MixMaterial::Create
          (MaterialHandle *materials,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *message;
  initializer_list<pbrt::FloatTextureHandle> ftex;
  FloatTextureHandle amount;
  BasicTextureEvaluator local_59;
  TextureParameterDictionary local_58;
  long local_40;
  MixMaterial *pMVar3;
  
  local_58.floatTextures =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
        *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58.floatTextures,"amount","");
  TextureParameterDictionary::GetFloatTexture
            (&local_58,(string *)parameters,0.5,(Allocator)&local_58.floatTextures);
  if ((ParameterDictionary *)local_58.floatTextures !=
      (ParameterDictionary *)&stack0xffffffffffffffc0) {
    operator_delete(local_58.floatTextures,local_40 + 1);
  }
  if (*(char *)(Options + 0xf) == '\x01') {
    if ((*(short *)((long)&(materials->
                           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                           ).bits + 6) == 0xb) ||
       ((materials[1].
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits & 0xffff000000000000) == 0xb000000000000)) {
      message = 
      "The GPU renderer doesn\'t currently support using \"mix\" materials as parameters to the \"mix\" material."
      ;
    }
    else {
      local_58.floatTextures =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
            *)local_58.dict;
      ftex._M_len = 1;
      ftex._M_array = (iterator)&local_58.floatTextures;
      bVar1 = BasicTextureEvaluator::CanEvaluate
                        (&local_59,ftex,
                         (initializer_list<pbrt::SpectrumTextureHandle>)(ZEXT816(0) << 0x40));
      if (bVar1) goto LAB_00389591;
      message = 
      "The GPU renderer currently only supports basic textures for its \"amount\" parameter.";
    }
    ErrorExit(loc,message);
  }
LAB_00389591:
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pMVar3 = (MixMaterial *)CONCAT44(extraout_var,iVar2);
  (pMVar3->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_58.dict;
  pMVar3->materials[0].
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = 0;
  pMVar3->materials[1].
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = 0;
  pMVar3->materials[0].
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (materials->
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          ).bits;
  pMVar3->materials[1].
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = materials[1].
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  return pMVar3;
}

Assistant:

MixMaterial *MixMaterial::Create(MaterialHandle materials[2],
                                 const TextureParameterDictionary &parameters,
                                 const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle amount = parameters.GetFloatTexture("amount", 0.5f, alloc);

    if (Options->useGPU) {
        // Check for this stuff here, where we can include the FileLoc in
        // the error message. Note that both of these limitations could be
        // relaxed if they were problematic; the issue is that we currently
        // resolve MixMaterials in the closest hit shader, where we'd like
        // to, for example, not introduce the complexity of potentially
        // recursively evaluating textures, etc.
        if (materials[0].Is<MixMaterial>() || materials[1].Is<MixMaterial>())
            ErrorExit(loc, "The GPU renderer doesn't currently support using "
                           "\"mix\" materials as parameters to the \"mix\" material.");
        if (!BasicTextureEvaluator().CanEvaluate({amount}, {}))
            ErrorExit(loc, "The GPU renderer currently only supports basic textures "
                           "for its \"amount\" parameter.");
    }

    return alloc.new_object<MixMaterial>(materials, amount);
}